

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmapstyle.cpp
# Opt level: O1

void __thiscall
QPixmapStyle::drawSlider
          (QPixmapStyle *this,QStyleOptionComplex *option,QPainter *painter,QWidget *widget)

{
  ControlDescriptor CVar1;
  int iVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined4 uVar5;
  Representation RVar6;
  char cVar7;
  Representation RVar8;
  ControlDescriptor CVar9;
  int iVar10;
  QStyleOptionComplex *this_00;
  QStyle *pQVar11;
  QStyle *pQVar12;
  ControlDescriptor CVar13;
  int iVar14;
  ControlDescriptor CVar15;
  int iVar16;
  long lVar17;
  Representation RVar18;
  ControlDescriptor CVar19;
  uint uVar20;
  long in_FS_OFFSET;
  undefined1 auVar21 [16];
  undefined1 local_e8 [16];
  undefined1 *local_d8;
  QPixmapStyleDescriptor local_c8;
  ControlDescriptor local_8c;
  undefined1 local_88 [12];
  Representation RStack_7c;
  double local_78;
  QStyle *pQStack_70;
  Data *local_68;
  char16_t *pcStack_60;
  double local_58;
  QStyle *local_50;
  Data *local_48;
  char16_t *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((option == (QStyleOptionComplex *)0x0) || ((option->super_QStyleOption).version < 1)) ||
     (this_00 = option, (option->super_QStyleOption).type != 0xf0001)) {
    this_00 = (QStyleOptionComplex *)0x0;
  }
  if (this_00 != (QStyleOptionComplex *)0x0) {
    lVar3 = *(long *)&(this->super_QCommonStyle).super_QStyle.field_0x8;
    CVar1 = (option->super_QStyleOption).state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
            super_QFlagsStorage<QStyle::StateFlag>.i;
    CVar13 = CVar1 & LE_Enabled;
    iVar2 = this_00[1].super_QStyleOption.version;
    pQVar11 = QStyle::proxy((QStyle *)this_00);
    auVar21 = (**(code **)(*(long *)pQVar11 + 0xd8))(pQVar11,3,option,2,widget);
    pQVar11 = auVar21._0_8_;
    if (((option->subControls).super_QFlagsStorageHelper<QStyle::SubControl,_4>.
         super_QFlagsStorage<QStyle::SubControl>.i & 1) != 0) {
      local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      stack0xffffffffffffff80 = &DAT_aaaaaaaaaaaaaaaa;
      pQVar12 = QStyle::proxy(pQVar11);
      _local_88 = (QRect)(**(code **)(*(long *)pQVar12 + 0xd8))(pQVar12,3,option,1,widget);
      RVar8 = local_88._0_4_;
      RVar18 = local_88._8_4_;
      uVar5 = local_88._4_4_;
      RVar6.m_i = RStack_7c.m_i;
      if ((int)local_88._4_4_ <= RStack_7c.m_i && RVar8.m_i <= RVar18.m_i) {
        CVar9 = (ControlDescriptor)((CVar1 & PB_Enabled) == BG_Background);
        CVar15 = SG_HActiveDisabled;
        if (CVar13 != BG_Background) {
          CVar15 = CVar9 ^ SG_HActivePressed;
        }
        CVar19 = SG_VActiveDisabled;
        if (CVar13 != BG_Background) {
          CVar19 = SG_VActivePressed - CVar9;
        }
        local_8c = CVar13 ^ SG_HDisabled;
        if (iVar2 != 1) {
          local_8c = (CVar13 == BG_Background) + SG_VEnabled;
        }
        if (iVar2 == 1) {
          CVar19 = CVar15;
        }
        drawCachedPixmap(this,local_8c,(QRect *)local_88,painter);
        local_8c = CVar19;
        QHash<QPixmapStyle::ControlDescriptor,_QPixmapStyleDescriptor>::value
                  (&local_c8,
                   (QHash<QPixmapStyle::ControlDescriptor,_QPixmapStyleDescriptor> *)(lVar3 + 0xe8),
                   &local_8c);
        local_d8 = &DAT_aaaaaaaaaaaaaaaa;
        local_e8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_e8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_58 = (double)CONCAT44((RVar6.m_i - uVar5) + 1,(RVar18.m_i - RVar8.m_i) + 1);
        QPixmapStylePrivate::getCachedPixmap
                  ((QPixmapStylePrivate *)local_e8,(ControlDescriptor)lVar3,
                   (QPixmapStyleDescriptor *)(ulong)local_8c,(QSize *)&local_c8);
        cVar7 = QPixmap::isNull();
        if (cVar7 == '\0') {
          auVar4._8_8_ = auVar21._8_8_ << 0x20;
          auVar4._0_8_ = (long)pQVar11 << 0x20;
          if (iVar2 != 1) {
            auVar4 = auVar21;
          }
          lVar17 = ((auVar4._8_8_ >> 0x20) + (auVar4._0_8_ >> 0x20)) / 2;
          local_88._8_4_ = (int)lVar17;
          local_78 = (double)RVar8.m_i;
          pQStack_70 = (QStyle *)(double)(int)uVar5;
          local_68 = (Data *)(double)((lVar17 - RVar8.m_i) + 1);
          pcStack_60 = (char16_t *)(double)(((long)RVar6.m_i - (long)(int)uVar5) + 1);
          local_58 = local_78;
          local_50 = pQStack_70;
          local_48 = local_68;
          local_40 = pcStack_60;
          QPainter::drawPixmap((QRectF *)painter,(QPixmap *)&local_58,(QRectF *)local_e8);
        }
        QPixmap::~QPixmap((QPixmap *)local_e8);
        if (&(local_c8.fileName.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_c8.fileName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_c8.fileName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          if (((local_c8.fileName.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i == 0) {
            QArrayData::deallocate(&(local_c8.fileName.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
    }
    if (((option->subControls).super_QFlagsStorageHelper<QStyle::SubControl,_4>.
         super_QFlagsStorage<QStyle::SubControl>.i & 2) != 0) {
      iVar10 = auVar21._0_4_;
      if (auVar21._4_4_ <= auVar21._12_4_ && iVar10 <= auVar21._8_4_) {
        uVar20 = CVar1 >> 1 & 2;
        iVar14 = 0xf;
        if (CVar13 != BG_Background) {
          iVar14 = uVar20 + 0xe;
        }
        iVar16 = 0xc;
        if (CVar13 != BG_Background) {
          iVar16 = uVar20 + 0xb;
        }
        if (iVar2 != 1) {
          iVar16 = iVar14;
        }
        local_e8._0_4_ = iVar16;
        QHash<QPixmapStyle::ControlPixmap,_QPixmapStylePixmap>::value
                  ((QPixmapStylePixmap *)&local_c8,
                   (QHash<QPixmapStyle::ControlPixmap,_QPixmapStylePixmap> *)(lVar3 + 0xf0),
                   (ControlPixmap *)local_e8);
        local_58 = (double)iVar10;
        local_50 = (QStyle *)(double)auVar21._4_4_;
        local_48 = (Data *)(double)(((long)auVar21._8_4_ - (long)iVar10) + 1);
        local_40 = (char16_t *)(double)(((auVar21._8_8_ >> 0x20) - ((long)pQVar11 >> 0x20)) + 1);
        local_68 = (Data *)0x0;
        pcStack_60 = (char16_t *)0x0;
        local_78 = 0.0;
        pQStack_70 = (QStyle *)0x0;
        QPainter::drawPixmap((QRectF *)painter,(QPixmap *)&local_58,(QRectF *)&local_c8);
        QPixmap::~QPixmap((QPixmap *)&local_c8);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPixmapStyle::drawSlider(const QStyleOptionComplex *option,
                              QPainter *painter, const QWidget *widget) const
{
#if QT_CONFIG(slider)
    Q_D(const QPixmapStyle);

    const QStyleOptionSlider *slider = qstyleoption_cast<const QStyleOptionSlider*>(option);
    if (!slider)
        return;

    const bool enabled = option->state & State_Enabled;
    const bool pressed = option->state & State_Sunken;
    const Qt::Orientation orient = slider->orientation;

    const QRect handle = proxy()->subControlRect(CC_Slider, option, SC_SliderHandle, widget);
    if (option->subControls & SC_SliderGroove) {
        QRect groove = proxy()->subControlRect(CC_Slider, option, SC_SliderGroove, widget);
        if (groove.isValid()) {
            // Draw the background
            ControlDescriptor control;
            if (orient == Qt::Horizontal)
                control = enabled ? SG_HEnabled : SG_HDisabled;
            else
                control = enabled ? SG_VEnabled : SG_VDisabled;
            drawCachedPixmap(control, groove, painter);

            // Draw the active part
            if (orient == Qt::Horizontal) {
                control = enabled ? (pressed ? SG_HActivePressed : SG_HActiveEnabled )
                                  : SG_HActiveDisabled;
            } else {
                control = enabled ? (pressed ? SG_VActivePressed : SG_VActiveEnabled )
                                  : SG_VActiveDisabled;
            }
            const QPixmapStyleDescriptor &desc = d->descriptors.value(control);
            const QPixmap pix = d->getCachedPixmap(control, desc, groove.size());
            if (!pix.isNull()) {
                groove.setRight(orient == Qt::Horizontal
                               ? handle.center().x() : handle.center().y());
                painter->drawPixmap(groove, pix, groove);
            }
        }
    }
    if (option->subControls & SC_SliderHandle) {
        if (handle.isValid()) {
            ControlPixmap pix;
            if (orient == Qt::Horizontal)
                pix = enabled ? (pressed ? SH_HPressed : SH_HEnabled) : SH_HDisabled;
            else
                pix = enabled ? (pressed ? SH_VPressed : SH_VEnabled) : SH_VDisabled;
            painter->drawPixmap(handle, d->pixmaps.value(pix).pixmap);
        }
    }
#else
    Q_UNUSED(option);
    Q_UNUSED(painter);
    Q_UNUSED(widget);
#endif // QT_CONFIG(slider)
}